

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_pgrsTimeWas(Curl_easy *data,timerid timer,curltime timestamp)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  timediff_t tVar10;
  int iVar11;
  long lVar12;
  time_t tVar13;
  timediff_t *ptVar14;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  
  tVar13 = timestamp.tv_sec;
  iVar11 = timestamp.tv_usec;
  auVar3 = timestamp._0_12_;
  switch(timer) {
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = tVar13;
    (data->progress).t_startop.tv_usec = iVar11;
    (data->progress).t_startqueue.tv_sec = tVar13;
    (data->progress).t_startqueue.tv_usec = iVar11;
    (data->progress).t_postqueue = 0;
    return;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = tVar13;
    (data->progress).t_startsingle.tv_usec = iVar11;
    puVar1 = &(data->progress).field_0x1ac;
    *puVar1 = *puVar1 & 0xfd;
    return;
  case TIMER_POSTQUEUE:
    uVar4 = (data->progress).t_startqueue.tv_sec;
    uVar5 = (data->progress).t_startqueue.tv_usec;
    older.tv_usec = uVar5;
    older.tv_sec = uVar4;
    older._12_4_ = 0;
    newer._12_4_ = 0;
    newer.tv_sec = auVar3._0_8_;
    newer.tv_usec = auVar3._8_4_;
    tVar10 = Curl_timediff_us(newer,older);
    ptVar14 = &(data->progress).t_postqueue;
    *ptVar14 = *ptVar14 + tVar10;
    return;
  case TIMER_NAMELOOKUP:
    ptVar14 = &(data->progress).t_nslookup;
    break;
  case TIMER_CONNECT:
    ptVar14 = &(data->progress).t_connect;
    break;
  case TIMER_APPCONNECT:
    ptVar14 = &(data->progress).t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    ptVar14 = &(data->progress).t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    bVar2 = (data->progress).field_0x1ac;
    if ((bVar2 & 2) != 0) {
      return;
    }
    ptVar14 = &(data->progress).t_starttransfer;
    (data->progress).field_0x1ac = bVar2 | 2;
    break;
  case TIMER_POSTRANSFER:
    ptVar14 = &(data->progress).t_posttransfer;
    break;
  case TIMER_STARTACCEPT:
    (data->progress).t_acceptdata.tv_sec = tVar13;
    (data->progress).t_acceptdata.tv_usec = iVar11;
    return;
  case TIMER_REDIRECT:
    uVar6 = (data->progress).start.tv_sec;
    uVar7 = (data->progress).start.tv_usec;
    older_00.tv_usec = uVar7;
    older_00.tv_sec = uVar6;
    older_00._12_4_ = 0;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = auVar3._0_8_;
    newer_00.tv_usec = auVar3._8_4_;
    tVar10 = Curl_timediff_us(newer_00,older_00);
    (data->progress).t_redirect = tVar10;
    (data->progress).t_startqueue.tv_sec = tVar13;
    (data->progress).t_startqueue.tv_usec = iVar11;
  default:
    goto switchD_0014db48_default;
  }
  uVar8 = (data->progress).t_startsingle.tv_sec;
  uVar9 = (data->progress).t_startsingle.tv_usec;
  older_01.tv_usec = uVar9;
  older_01.tv_sec = uVar8;
  older_01._12_4_ = 0;
  newer_01._12_4_ = 0;
  newer_01.tv_sec = auVar3._0_8_;
  newer_01.tv_usec = auVar3._8_4_;
  tVar10 = Curl_timediff_us(newer_01,older_01);
  lVar12 = 1;
  if (1 < tVar10) {
    lVar12 = tVar10;
  }
  *ptVar14 = *ptVar14 + lVar12;
switchD_0014db48_default:
  return;
}

Assistant:

void Curl_pgrsTimeWas(struct Curl_easy *data, timerid timer,
                      struct curltime timestamp)
{
  timediff_t *delta = NULL;

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = timestamp;
    data->progress.t_startqueue = timestamp;
    data->progress.t_postqueue = 0;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single transfer */
    data->progress.t_startsingle = timestamp;
    data->progress.is_t_startransfer_set = FALSE;
    break;
  case TIMER_POSTQUEUE:
    /* Queue time is accumulative from all involved redirects */
    data->progress.t_postqueue +=
      Curl_timediff_us(timestamp, data->progress.t_startqueue);
    break;
  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = timestamp;
    break;
  case TIMER_NAMELOOKUP:
    delta = &data->progress.t_nslookup;
    break;
  case TIMER_CONNECT:
    delta = &data->progress.t_connect;
    break;
  case TIMER_APPCONNECT:
    delta = &data->progress.t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    delta = &data->progress.t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    delta = &data->progress.t_starttransfer;
    /* prevent updating t_starttransfer unless:
     *   1) this is the first time we are setting t_starttransfer
     *   2) a redirect has occurred since the last time t_starttransfer was set
     * This prevents repeated invocations of the function from incorrectly
     * changing the t_starttransfer time.
     */
    if(data->progress.is_t_startransfer_set) {
      return;
    }
    else {
      data->progress.is_t_startransfer_set = TRUE;
      break;
    }
  case TIMER_POSTRANSFER:
    delta = &data->progress.t_posttransfer;
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_timediff_us(timestamp,
                                                 data->progress.start);
    data->progress.t_startqueue = timestamp;
    break;
  }
  if(delta) {
    timediff_t us = Curl_timediff_us(timestamp, data->progress.t_startsingle);
    if(us < 1)
      us = 1; /* make sure at least one microsecond passed */
    *delta += us;
  }
}